

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void AxCPU(CUPDLPwork *w,cupdlp_float *ax,cupdlp_float *x)

{
  double dVar1;
  int iVar2;
  int iVar3;
  CUPDLPproblem *pCVar4;
  CUPDLPcsc *pCVar5;
  cupdlp_int *pcVar6;
  cupdlp_int *pcVar7;
  cupdlp_float *pcVar8;
  long lVar9;
  CUPDLPcsc *matrix;
  long lVar10;
  long lVar11;
  
  pCVar4 = w->problem;
  memset(ax,0,(long)pCVar4->data->nRows << 3);
  lVar9 = (long)pCVar4->data->nCols;
  if (0 < lVar9) {
    pCVar5 = w->problem->data->csc_matrix;
    pcVar6 = pCVar5->colMatBeg;
    lVar10 = 0;
    do {
      iVar2 = pcVar6[lVar10];
      lVar11 = (long)iVar2;
      iVar3 = pcVar6[lVar10 + 1];
      if (iVar2 < iVar3) {
        dVar1 = x[lVar10];
        pcVar7 = pCVar5->colMatIdx;
        pcVar8 = pCVar5->colMatElem;
        do {
          ax[pcVar7[lVar11]] = pcVar8[lVar11] * dVar1 + ax[pcVar7[lVar11]];
          lVar11 = lVar11 + 1;
        } while (iVar3 != lVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

void AxCPU(CUPDLPwork *w, cupdlp_float *ax, const cupdlp_float *x) {
  // #if PDHG_USE_TIMERS
  //     ++w->timers->nAxCalls;
  //     cupdlp_float dStartTime = getTimeStamp();
  // #endif

  CUPDLPproblem *lp = w->problem;

  /* no indentity currently

  FILL_ZERO(ax, lp->data->nRows);

  // [A I]*x
  for (cupdlp_int iSeq = ncols, iRow = 0; iSeq < lp->nSeq; ++iSeq, ++iRow)
  {
      if ((pdhg->lower[iSeq] > -INFINITY) && (pdhg->upper[iSeq] < INFINITY))
      {
          ax[iRow] = scaling->rowScale ? scaling->rowScale[iRow] * x[iSeq] :
  x[iSeq];
      }
      else
      {
          ax[iRow] = 0.0;
      }
  }
  */

  memset(ax, 0, sizeof(cupdlp_float) * lp->data->nRows);

  for (cupdlp_int iCol = 0; iCol < lp->data->nCols; ++iCol) {
    ScatterCol(w, iCol, x[iCol], ax);
  }

  // #if PDHG_USE_TIMERS
  //     w->timers->dAxTime += getTimeStamp() - dStartTime;
  // #endif
}